

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O1

void __thiscall xr_entity_factory::load_system_ini(xr_entity_factory *this,char *game_config)

{
  xr_ini_file *pxVar1;
  
  pxVar1 = this->m_system_ini;
  if (pxVar1 != (xr_ini_file *)0x0) {
    xray_re::xr_ini_file::~xr_ini_file(pxVar1);
    operator_delete(pxVar1,0x18);
  }
  pxVar1 = (xr_ini_file *)operator_new(0x18);
  (pxVar1->m_sections).
  super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pxVar1->m_sections).
  super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pxVar1->m_sections).
  super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  xray_re::xr_ini_file::load(pxVar1,game_config,"system.ltx");
  this->m_system_ini = pxVar1;
  return;
}

Assistant:

void xr_entity_factory::load_system_ini(const char* game_config)
{
	delete m_system_ini;
	m_system_ini = new xr_ini_file(game_config, "system.ltx");
}